

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O1

ostream * Gs::operator<<(ostream *stream,Matrix<float,_10UL,_10UL> *mat)

{
  ulong uVar1;
  byte bVar2;
  undefined1 uVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  size_t c;
  long lVar7;
  float *pfVar8;
  size_t lengths [10];
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  long local_98;
  float *local_90;
  ulong auStack_88 [11];
  
  lVar7 = 0;
  pfVar8 = mat->m_;
  do {
    auStack_88[lVar7] = 0;
    lVar6 = 0;
    do {
      sVar4 = Details::Length<float>((float *)((long)pfVar8 + lVar6));
      if (sVar4 < auStack_88[lVar7]) {
        sVar4 = auStack_88[lVar7];
      }
      auStack_88[lVar7] = sVar4;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x28);
    lVar7 = lVar7 + 1;
    pfVar8 = pfVar8 + 10;
  } while (lVar7 != 10);
  local_98 = 0;
  do {
    bVar2 = (local_98 != 9) << 5 | 0x5c;
    if (local_98 == 0) {
      bVar2 = 0x2f;
    }
    local_b8._0_1_ = bVar2;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_b8,1);
    lVar7 = 0;
    local_90 = mat->m_;
    do {
      uVar1 = auStack_88[lVar7];
      sVar4 = Details::Length<float>(mat->m_);
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct((ulong)&local_b8,((char)uVar1 - (char)sVar4) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_b8,local_b0);
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      poVar5 = std::ostream::_M_insert<double>((double)mat->m_[0]);
      local_b8._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_b8,1);
      lVar6 = local_98;
      lVar7 = lVar7 + 1;
      mat = (Matrix<float,_10UL,_10UL> *)((long)mat + 0x28);
    } while (lVar7 != 10);
    uVar3 = 0x7c;
    if (local_98 == 9) {
      uVar3 = 0x2f;
    }
    if (local_98 == 0) {
      uVar3 = 0x5c;
    }
    local_b8 = (char *)CONCAT71(local_b8._1_7_,uVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_b8,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_98 = lVar6 + 1;
    mat = (Matrix<float,_10UL,_10UL> *)(local_90 + 1);
  } while (local_98 != 10);
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}